

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::TreeNodeBehavior(ImGuiID id,ImGuiTreeNodeFlags flags,char *label,char *label_end)

{
  ImU32 *pIVar1;
  ImGuiItemStatusFlags *pIVar2;
  int *piVar3;
  ImGuiWindow *pIVar4;
  ImVec2 pos;
  ImVec2 pos_00;
  ImVec2 pos_01;
  ImVec2 pos_02;
  ImVec2 IVar5;
  ImVec2 p_min;
  ImVec2 p_min_00;
  ImVec2 IVar6;
  ImVec2 p_max;
  ImVec2 p_max_00;
  undefined1 auVar7 [16];
  ImGuiContext *pIVar8;
  bool bVar9;
  bool bVar10;
  byte bVar11;
  byte bVar12;
  ImU32 IVar13;
  ImGuiWindowTempData *pIVar14;
  uint uVar15;
  ImGuiID IVar16;
  uint uVar17;
  float fVar18;
  float fVar19;
  bool held;
  bool hovered;
  ImRect interact_bb;
  ImVec2 label_size;
  bool local_ea;
  bool local_e9;
  ImRect local_e8;
  undefined1 local_d8 [16];
  ImVec2 local_c8;
  float local_bc;
  float local_b8;
  float fStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  float local_a8;
  float fStack_a4;
  undefined8 uStack_a0;
  char *local_98;
  char *local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  ImRect local_68;
  ImVec2 local_50;
  undefined1 local_48 [16];
  ImVec2 local_38;
  
  pIVar8 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  pIVar4->WriteAccessed = true;
  if (pIVar4->SkipItems != false) {
    return false;
  }
  if ((flags & 0x402U) == 0) {
    fVar19 = (pIVar4->DC).CurrLineTextBaseOffset;
    fVar18 = (pIVar8->Style).FramePadding.y;
    if (fVar18 <= fVar19) {
      fVar19 = fVar18;
    }
  }
  else {
    fVar19 = (pIVar8->Style).FramePadding.y;
  }
  local_d8 = ZEXT416((uint)fVar19);
  local_78 = ZEXT416((uint)(pIVar8->Style).FramePadding.x);
  if (label_end == (char *)0x0) {
    label_end = FindRenderedTextEnd(label,(char *)0x0);
  }
  local_98 = label_end;
  local_50 = CalcTextSize(label,label_end,false,-1.0);
  pIVar14 = (ImGuiWindowTempData *)&pIVar4->WorkRect;
  if (((uint)flags >> 0xc & 1) == 0) {
    pIVar14 = &pIVar4->DC;
  }
  fVar19 = (pIVar4->DC).CurrLineSize.y;
  local_68.Min.x = pIVar8->FontSize;
  fVar18 = (pIVar8->Style).FramePadding.y;
  fVar18 = fVar18 + fVar18 + local_68.Min.x;
  if (fVar18 <= fVar19) {
    fVar19 = fVar18;
  }
  fVar18 = (float)local_d8._0_4_ + (float)local_d8._0_4_ + local_50.y;
  uVar17 = -(uint)(fVar18 <= fVar19);
  local_68.Min.y = (float)(uVar17 & (uint)fVar19 | ~uVar17 & (uint)fVar18);
  local_b8 = (pIVar14->CursorPos).x;
  local_e8.Min.y = (pIVar4->DC).CursorPos.y;
  local_e8.Max.x = (pIVar4->WorkRect).Max.x;
  local_e8.Max.y = local_68.Min.y + local_e8.Min.y;
  if ((flags & 2U) == 0) {
    fVar19 = 2.0;
  }
  else {
    fVar19 = (pIVar4->WindowPadding).x * 0.5;
    local_b8 = local_b8 - (float)(int)(fVar19 + -1.0);
    local_e8.Max.x = local_e8.Max.x + (float)(int)fVar19;
    fVar19 = 3.0;
  }
  local_a8 = fVar19 * (float)local_78._0_4_ + local_68.Min.x;
  fVar19 = (pIVar4->DC).CurrLineTextBaseOffset;
  uVar17 = -(uint)(fVar19 <= (float)local_d8._0_4_);
  local_bc = (float)local_78._0_4_ + (float)local_78._0_4_;
  local_68.Min.x =
       (float)(-(uint)(0.0 < local_50.x) & (uint)(local_bc + local_50.x)) + local_68.Min.x;
  local_88 = ZEXT416((uint)local_a8);
  local_a8 = (pIVar4->DC).CursorPos.x + local_a8;
  fStack_a4 = (float)(~uVar17 & (uint)fVar19 | uVar17 & local_d8._0_4_) + local_e8.Min.y;
  uStack_a0 = 0;
  local_c8.y = fStack_a4;
  local_c8.x = local_a8;
  local_48 = ZEXT416((uint)local_68.Min.x);
  local_e8.Min.x = local_b8;
  local_90 = label;
  ItemSize(&local_68.Min,(float)local_d8._0_4_);
  local_68.Min.y = local_e8.Min.y;
  local_68.Min.x = local_e8.Min.x;
  local_68.Max.x = local_e8.Max.x;
  if ((flags & 0x1802U) == 0) {
    fVar19 = (pIVar8->Style).ItemSpacing.x;
    local_68.Max.x = fVar19 + fVar19 + (float)local_48._0_4_ + local_b8;
  }
  local_68.Max.y = local_e8.Max.y;
  bVar9 = TreeNodeBehaviorIsOpen(id,flags);
  if (((bVar9) && ((flags & 0x2008U) == 0x2000)) && (pIVar8->NavIdIsAlive == false)) {
    pIVar1 = &(pIVar4->DC).TreeJumpToParentOnPopMask;
    *pIVar1 = *pIVar1 | 1 << ((byte)(pIVar4->DC).TreeDepth & 0x1f);
  }
  bVar10 = ItemAdd(&local_68,id,(ImRect *)0x0,0);
  pIVar2 = &(pIVar8->LastItemData).StatusFlags;
  *(byte *)pIVar2 = (byte)*pIVar2 | 2;
  IVar5.y = local_e8.Min.y;
  IVar5.x = local_e8.Min.x;
  IVar6.y = local_e8.Max.y;
  IVar6.x = local_e8.Max.x;
  (pIVar8->LastItemData).DisplayRect.Min = IVar5;
  (pIVar8->LastItemData).DisplayRect.Max = IVar6;
  if (!bVar10) {
    if (!bVar9 || (char)((flags & 8U) >> 3) != '\0') {
      return bVar9;
    }
    pIVar4 = GImGui->CurrentWindow;
    Indent(0.0);
    piVar3 = &(pIVar4->DC).TreeDepth;
    *piVar3 = *piVar3 + 1;
    PushOverrideID(id);
    return true;
  }
  uVar15 = (flags & 4U) * 0x400;
  uVar17 = uVar15 + 0x200;
  if (((uint)flags >> 8 & 1) != 0) {
    uVar17 = uVar15;
  }
  local_b8 = local_a8 - (float)local_88._0_4_;
  fVar19 = (pIVar8->Style).TouchExtraPadding.x;
  fVar18 = (pIVar8->IO).MousePos.x;
  fStack_b4 = fStack_a4;
  uStack_b0 = (undefined4)uStack_a0;
  uStack_ac = uStack_a0._4_4_;
  if (local_b8 - fVar19 <= fVar18) {
    uVar15 = uVar17 + 0x10000;
    if (fVar19 + local_bc + pIVar8->FontSize + local_b8 <= fVar18) goto LAB_0016864b;
    if (pIVar4 == pIVar8->HoveredWindow) {
      uVar15 = uVar17;
    }
    uVar15 = uVar15 | 0x10;
    local_d8._0_4_ = (int)CONCAT71((uint7)(uint3)(uVar17 >> 8),1);
  }
  else {
    uVar15 = uVar17 | 0x10000;
LAB_0016864b:
    if ((flags & 0x40U) == 0) {
      uVar15 = uVar15 | 0x20;
    }
    else {
      uVar15 = uVar15 | 0x120;
    }
    auVar7._12_4_ = 0;
    auVar7._0_12_ = local_d8._4_12_;
    local_d8 = auVar7 << 0x20;
  }
  bVar10 = ButtonBehavior(&local_68,id,&local_e9,&local_ea,uVar15);
  if (((uint)flags >> 8 & 1) != 0) goto LAB_0016870e;
  if (bVar10) {
    if (pIVar8->DragDropHoldJustPressedId == id) {
      bVar11 = !bVar9;
    }
    else {
      if (((flags & 0xc0U) == 0) || (pIVar8->NavActivateId == id)) {
        bVar12 = 1;
      }
      else {
        bVar12 = 0;
      }
      if ((char)flags < '\0') {
        bVar11 = 0;
        if (local_d8[0] != '\0') {
          bVar11 = pIVar8->NavDisableMouseHover ^ 1;
        }
        bVar12 = bVar12 | bVar11;
      }
      bVar11 = bVar12;
      if (((flags & 0x40U) != 0) && (bVar11 = 1, (pIVar8->IO).MouseClickedCount[0] != 2)) {
        bVar11 = bVar12;
      }
    }
  }
  else {
    bVar11 = 0;
  }
  IVar16 = pIVar8->NavId;
  if (IVar16 == id) {
    if (bVar9 && pIVar8->NavMoveDir == 0) {
      NavMoveRequestCancel();
      IVar16 = pIVar8->NavId;
      bVar11 = 1;
      goto LAB_001686d1;
    }
LAB_001686d5:
    if (pIVar8->NavMoveDir != 1 || bVar9) goto LAB_001686e5;
    NavMoveRequestCancel();
  }
  else {
LAB_001686d1:
    if (IVar16 == id) goto LAB_001686d5;
LAB_001686e5:
    if (bVar11 == 0) goto LAB_0016870e;
  }
  bVar9 = !bVar9;
  ImGuiStorage::SetInt((pIVar4->DC).StateStorage,id,(uint)bVar9);
  pIVar2 = &(pIVar8->LastItemData).StatusFlags;
  *(byte *)pIVar2 = (byte)*pIVar2 | 0x10;
LAB_0016870e:
  if ((flags & 4U) != 0) {
    SetItemAllowOverlap();
  }
  IVar13 = GetColorU32(0,1.0);
  local_d8._0_4_ = IVar13;
  if ((flags & 2U) == 0) {
    if (((flags & 1U) == 0 & (local_e9 ^ 1U)) == 0) {
      uVar17 = 0x1a;
      if ((local_ea & local_e9) == 0) {
        uVar17 = local_e9 | 0x18;
      }
      IVar13 = GetColorU32(uVar17,1.0);
      p_min.y = local_e8.Min.y;
      p_min.x = local_e8.Min.x;
      p_max.y = local_e8.Max.y;
      p_max.x = local_e8.Max.x;
      RenderFrame(p_min,p_max,IVar13,false,0.0);
    }
    RenderNavHighlight(&local_e8,id,2);
    if (((uint)flags >> 9 & 1) == 0) {
      if (((uint)flags >> 8 & 1) == 0) {
        pos_02.y = pIVar8->FontSize * 0.15 + fStack_a4;
        pos_02.x = (float)local_78._0_4_ + local_b8;
        RenderArrow(pIVar4->DrawList,pos_02,local_d8._0_4_,(uint)bVar9 * 2 + 1,0.7);
      }
    }
    else {
      pos_01.y = pIVar8->FontSize * 0.5 + fStack_a4;
      pos_01.x = -(float)local_88._0_4_ * 0.5 + local_a8;
      RenderBullet(pIVar4->DrawList,pos_01,local_d8._0_4_);
    }
    if (pIVar8->LogEnabled == true) {
      LogSetNextTextDecoration(">",(char *)0x0);
    }
    RenderText(local_c8,local_90,local_98,false);
  }
  else {
    uVar15 = (local_ea ^ 1U) & local_e9 | 0x18;
    uVar17 = 0x1a;
    if ((local_e9 & 1U) == 0) {
      uVar17 = uVar15;
    }
    if (local_ea == false) {
      uVar17 = uVar15;
    }
    IVar13 = GetColorU32(uVar17,1.0);
    p_min_00.y = local_e8.Min.y;
    p_min_00.x = local_e8.Min.x;
    p_max_00.y = local_e8.Max.y;
    p_max_00.x = local_e8.Max.x;
    RenderFrame(p_min_00,p_max_00,IVar13,true,(pIVar8->Style).FrameRounding);
    RenderNavHighlight(&local_e8,id,2);
    if (((uint)flags >> 9 & 1) == 0) {
      if (((uint)flags >> 8 & 1) == 0) {
        pos_00.y = fStack_a4;
        pos_00.x = (float)local_78._0_4_ + local_b8;
        RenderArrow(pIVar4->DrawList,pos_00,local_d8._0_4_,(uint)bVar9 * 2 + 1,1.0);
      }
      else {
        local_c8.x = local_b8;
      }
    }
    else {
      pos.y = pIVar8->FontSize * 0.5 + fStack_a4;
      pos.x = -(float)local_88._0_4_ * 0.6 + local_a8;
      RenderBullet(pIVar4->DrawList,pos,local_d8._0_4_);
    }
    if (((uint)flags >> 0x14 & 1) != 0) {
      local_e8.Max.x = local_e8.Max.x - (pIVar8->FontSize + (pIVar8->Style).FramePadding.x);
    }
    if (pIVar8->LogEnabled == true) {
      LogSetNextTextDecoration("###","###");
    }
    local_38.x = 0.0;
    local_38.y = 0.0;
    RenderTextClipped(&local_c8,&local_e8.Max,local_90,local_98,&local_50,&local_38,(ImRect *)0x0);
  }
  if (bVar9 == true && (char)((flags & 8U) >> 3) == '\0') {
    pIVar4 = GImGui->CurrentWindow;
    Indent(0.0);
    piVar3 = &(pIVar4->DC).TreeDepth;
    *piVar3 = *piVar3 + 1;
    PushOverrideID(id);
  }
  return bVar9;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}